

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

void anon_unknown.dwarf_21a7::PrintUsage(ostream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  string local_50;
  
  cVar3 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," x2x - data type transformation",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       x2x [ options ] [ infile ] > stdout",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       +type : input and output data types                [",0x3b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"da",2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"c","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"C","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"s","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"S","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"h","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"H","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"i","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"I","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"l","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"L","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"f","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"d","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 ",0x11);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"e","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a","");
  sptk::PrintDataType(&local_50,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -r    : rounding                           (  bool)[",0x3b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  __s = sptk::ConvertBooleanToString(false);
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -e e  : warning type of out-of-range value (   int)[",0x3b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)stream,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"][ 0 <= e <= 2 ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 0 (no warning)",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                 1 (output the index to stderr)",0x2f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                 2 (output the index to stderr",0x2e);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                    and exit immediately)",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -c c  : number of columns                  (   int)[",0x3b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)stream,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"][ 1 <= c <=   ]",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -f f  : print format                       (string)[",0x3b);
  lVar2 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h    : print this message",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  infile:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       data sequence                                      [stdin]",0x41);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"       transformed data sequence",0x20)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  notice:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       values of f and c are valid only if output data type is ascii",0x44);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " x2x - data type transformation" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       x2x [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       +type : input and output data types                [" << std::setw(5) << std::right << kDefaultDataTypes  << "]" << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("c", stream); sptk::PrintDataType("C", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("s", stream); sptk::PrintDataType("S", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("h", stream); sptk::PrintDataType("H", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("i", stream); sptk::PrintDataType("I", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("l", stream); sptk::PrintDataType("L", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("f", stream); sptk::PrintDataType("d", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("e", stream); sptk::PrintDataType("a", stream); *stream << std::endl;  // NOLINT
  *stream << "       -r    : rounding                           (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultRoundingFlag) << "]" << std::endl;  // NOLINT
  *stream << "       -e e  : warning type of out-of-range value (   int)[" << std::setw(5) << std::right << kDefaultWarningType << "][ 0 <= e <= 2 ]" << std::endl;  // NOLINT
  *stream << "                 0 (no warning)" << std::endl;
  *stream << "                 1 (output the index to stderr)" << std::endl;
  *stream << "                 2 (output the index to stderr" << std::endl;
  *stream << "                    and exit immediately)" << std::endl;
  *stream << "       -c c  : number of columns                  (   int)[" << std::setw(5) << std::right << kDefaultNumColumn   << "][ 1 <= c <=   ]" << std::endl;  // NOLINT
  *stream << "       -f f  : print format                       (string)[" << std::setw(5) << std::right << "N/A"               << "]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence                                      [stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       transformed data sequence" << std::endl;
  *stream << "  notice:" << std::endl;
  *stream << "       values of f and c are valid only if output data type is ascii" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}